

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O0

uint __thiscall llvm::StringMapImpl::LookupBucketFor(StringMapImpl *this,StringRef Name)

{
  StringMapEntryBase *pSVar1;
  StringMapEntryBase *pSVar2;
  char *__s2;
  uint32_t in_ECX;
  bool bVar3;
  StringRef Buffer;
  undefined1 local_108 [16];
  StringMapImpl *local_f8;
  char *local_f0;
  char *local_e8;
  char *ItemStr;
  StringMapEntryBase *BucketItem;
  int FirstTombstone;
  uint ProbeAmt;
  uint *HashTable;
  StringMapImpl *pSStack_c0;
  uint BucketNo;
  char *local_b8;
  uint32_t local_b0;
  uint local_ac;
  uint FullHashValue;
  uint HTSize;
  StringMapImpl *this_local;
  StringRef Name_local;
  StringMapImpl *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  undefined1 *local_48;
  StringMapImpl **local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  StringMapImpl *local_18;
  int local_c;
  
  Name_local.Data = (char *)Name.Length;
  this_local = (StringMapImpl *)Name.Data;
  local_ac = this->NumBuckets;
  _FullHashValue = this;
  if (local_ac == 0) {
    init(this,(EVP_PKEY_CTX *)0x10);
    local_ac = this->NumBuckets;
  }
  pSStack_c0 = this_local;
  local_b8 = Name_local.Data;
  Buffer.Length = 0;
  Buffer.Data = Name_local.Data;
  local_b0 = djbHash((llvm *)this_local,Buffer,in_ECX);
  HashTable._4_4_ = local_b0 & local_ac - 1;
  _FirstTombstone = this->TheTable + (ulong)this->NumBuckets + 1;
  BucketItem._4_4_ = 1;
  BucketItem._0_4_ = 0xffffffff;
  do {
    pSVar1 = this->TheTable[HashTable._4_4_];
    if (pSVar1 == (StringMapEntryBase *)0x0) {
      if ((uint)BucketItem == 0xffffffff) {
        *(uint32_t *)((long)_FirstTombstone + (ulong)HashTable._4_4_ * 4) = local_b0;
        Name_local.Length._4_4_ = HashTable._4_4_;
      }
      else {
        *(uint32_t *)((long)_FirstTombstone + (long)(int)(uint)BucketItem * 4) = local_b0;
        Name_local.Length._4_4_ = (uint)BucketItem;
      }
      return Name_local.Length._4_4_;
    }
    ItemStr = (char *)pSVar1;
    pSVar2 = getTombstoneVal();
    if (pSVar1 == pSVar2) {
      if ((uint)BucketItem == 0xffffffff) {
        BucketItem._0_4_ = HashTable._4_4_;
      }
    }
    else if (*(uint32_t *)((long)_FirstTombstone + (ulong)HashTable._4_4_ * 4) == local_b0) {
      __s2 = ItemStr + this->ItemSize;
      local_f8 = this_local;
      local_f0 = Name_local.Data;
      local_e8 = __s2;
      local_58 = (char *)StringMapEntryBase::getKeyLength((StringMapEntryBase *)ItemStr);
      local_48 = local_108;
      local_68 = local_f8;
      local_60 = local_f0;
      local_40 = &local_68;
      bVar3 = false;
      local_50 = __s2;
      local_38 = __s2;
      local_30 = local_58;
      if (local_f0 == local_58) {
        local_18 = local_f8;
        local_28 = local_58;
        local_20 = __s2;
        if (local_58 == (char *)0x0) {
          local_c = 0;
        }
        else {
          local_c = memcmp(local_f8,__s2,(size_t)local_58);
        }
        bVar3 = local_c == 0;
      }
      if (bVar3) {
        return HashTable._4_4_;
      }
    }
    HashTable._4_4_ = HashTable._4_4_ + BucketItem._4_4_ & local_ac - 1;
    BucketItem._4_4_ = BucketItem._4_4_ + 1;
  } while( true );
}

Assistant:

unsigned StringMapImpl::LookupBucketFor(StringRef Name) {
  unsigned HTSize = NumBuckets;
  if (HTSize == 0) {  // Hash table unallocated so far?
    init(16);
    HTSize = NumBuckets;
  }
  unsigned FullHashValue = djbHash(Name, 0);
  unsigned BucketNo = FullHashValue & (HTSize-1);
  unsigned *HashTable = (unsigned *)(TheTable + NumBuckets + 1);

  unsigned ProbeAmt = 1;
  int FirstTombstone = -1;
  while (true) {
    StringMapEntryBase *BucketItem = TheTable[BucketNo];
    // If we found an empty bucket, this key isn't in the table yet, return it.
    if (LLVM_LIKELY(!BucketItem)) {
      // If we found a tombstone, we want to reuse the tombstone instead of an
      // empty bucket.  This reduces probing.
      if (FirstTombstone != -1) {
        HashTable[FirstTombstone] = FullHashValue;
        return FirstTombstone;
      }

      HashTable[BucketNo] = FullHashValue;
      return BucketNo;
    }

    if (BucketItem == getTombstoneVal()) {
      // Skip over tombstones.  However, remember the first one we see.
      if (FirstTombstone == -1) FirstTombstone = BucketNo;
    } else if (LLVM_LIKELY(HashTable[BucketNo] == FullHashValue)) {
      // If the full hash value matches, check deeply for a match.  The common
      // case here is that we are only looking at the buckets (for item info
      // being non-null and for the full hash value) not at the items.  This
      // is important for cache locality.

      // Do the comparison like this because Name isn't necessarily
      // null-terminated!
      char *ItemStr = (char*)BucketItem+ItemSize;
      if (Name == StringRef(ItemStr, BucketItem->getKeyLength())) {
        // We found a match!
        return BucketNo;
      }
    }

    // Okay, we didn't find the item.  Probe to the next bucket.
    BucketNo = (BucketNo+ProbeAmt) & (HTSize-1);

    // Use quadratic probing, it has fewer clumping artifacts than linear
    // probing and has good cache behavior in the common case.
    ++ProbeAmt;
  }
}